

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_set_sync_write
          (t_rs_generator *this,string *set_var,bool set_var_is_ref,t_set *tset)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_type *ttype;
  ostream *poVar3;
  char *pcVar4;
  allocator local_91;
  string local_90;
  string ref;
  string local_50;
  
  ttype = tset->elem_type_;
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_(&ref,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&ref);
  poVar3 = std::operator<<(poVar3,"o_prot.write_set_begin(");
  pcVar4 = "&TSetIdentifier::new(";
  poVar3 = std::operator<<(poVar3,"&TSetIdentifier::new(");
  to_rust_field_type_enum_abi_cxx11_(&local_90,(t_rs_generator *)pcVar4,ttype);
  poVar3 = std::operator<<(poVar3,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(poVar3,(string *)set_var);
  poVar3 = std::operator<<(poVar3,".len() as i32");
  poVar3 = std::operator<<(poVar3,")");
  poVar3 = std::operator<<(poVar3,")?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&ref);
  pcVar4 = "&";
  if (set_var_is_ref) {
    pcVar4 = "";
  }
  std::__cxx11::string::string((string *)&ref,pcVar4,(allocator *)&local_90);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"for e in ");
  poVar3 = std::operator<<(poVar3,(string *)&ref);
  poVar3 = std::operator<<(poVar3,(string *)set_var);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  std::__cxx11::string::string((string *)&local_50,"e",&local_91);
  string_container_write_variable(&local_90,this,ttype,&local_50);
  render_type_sync_write(this,&local_90,true,ttype);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"o_prot.write_set_end()?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&ref);
  return;
}

Assistant:

void t_rs_generator::render_set_sync_write(const string &set_var, bool set_var_is_ref, t_set *tset) {
  t_type* elem_type = tset->get_elem_type();

  f_gen_
    << indent()
    << "o_prot.write_set_begin("
    << "&TSetIdentifier::new("
    << to_rust_field_type_enum(elem_type) << ", "
    << set_var << ".len() as i32" << ")"
    << ")?;"
    << endl;

  string ref(set_var_is_ref ? "" : "&");
  f_gen_ << indent() << "for e in " << ref << set_var << " {" << endl;
  indent_up();
  render_type_sync_write(string_container_write_variable(elem_type, "e"), true, elem_type);
  indent_down();
  f_gen_ << indent() << "}" << endl;
  f_gen_ << indent() << "o_prot.write_set_end()?;" << endl;
}